

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::set_up_values_of_landscapes
          (Persistence_landscape_on_grid *this,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *p,
          double grid_min_,double grid_max_,size_t number_of_points_,uint number_of_levels)

{
  vector<double,std::allocator<double>> *pvVar1;
  double dVar2;
  iterator iVar3;
  pointer pvVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var6;
  pointer pdVar7;
  bool bVar8;
  double *pdVar9;
  pointer ppVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 *puVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  size_t i;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  pointer pvVar23;
  _Iter_less_iter __comp;
  double local_98;
  allocator_type local_89;
  double local_88;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  ulong local_60;
  ulong local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_50;
  long local_38;
  
  local_98 = grid_max_;
  if (((grid_min_ == 1.79769313486232e+308) && (!NAN(grid_min_))) ||
     ((local_88 = grid_min_, grid_max_ == 1.79769313486232e+308 && (!NAN(grid_max_))))) {
    ppVar10 = (p->
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar15 = (long)(p->
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10;
    if (lVar15 == 0) {
      dVar20 = 1.79769313486232e+308;
      local_98 = 2.2250738585072014e-308;
    }
    else {
      lVar15 = lVar15 >> 4;
      pdVar9 = &ppVar10->second;
      local_98 = 2.2250738585072014e-308;
      dVar20 = 1.79769313486232e+308;
      do {
        dVar2 = ((pair<double,_double> *)(pdVar9 + -1))->first;
        if (dVar20 <= ((pair<double,_double> *)(pdVar9 + -1))->first) {
          dVar2 = dVar20;
        }
        dVar20 = dVar2;
        dVar2 = *pdVar9;
        if (*pdVar9 <= local_98) {
          dVar2 = local_98;
        }
        local_98 = dVar2;
        pdVar9 = pdVar9 + 2;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    if ((grid_min_ == 1.79769313486232e+308) && (!NAN(grid_min_))) {
      local_98 = grid_max_;
    }
    local_88 = grid_min_;
    if ((grid_min_ == 1.79769313486232e+308) && (local_88 = grid_min_, !NAN(grid_min_))) {
      local_88 = dVar20;
    }
  }
  local_80 = p;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_50,number_of_points_ + 1,&local_89);
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->values_of_landscapes).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->values_of_landscapes).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->values_of_landscapes).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_50.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_50.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_50.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_50);
  this->grid_min = local_88;
  this->grid_max = local_98;
  if (local_98 <= local_88) {
    puVar14 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar14 = 
    "Wrong parameters of grid_min and grid_max given to the procedure. The program will now terminate.\n"
    ;
    __cxa_throw(puVar14,&char_const*::typeinfo,0);
  }
  ppVar10 = (local_80->
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((local_80->
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppVar10) {
    auVar21._8_4_ = (int)(number_of_points_ >> 0x20);
    auVar21._0_8_ = number_of_points_;
    auVar21._12_4_ = 0x45300000;
    pvVar23 = (pointer)((local_98 - local_88) /
                       ((auVar21._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)number_of_points_) - 4503599627370496.0)));
    local_58 = (ulong)number_of_levels;
    local_60 = (ulong)(number_of_levels - 1);
    lVar15 = 0;
    do {
      dVar20 = (ppVar10[lVar15].first - local_88) / (double)pvVar23;
      uVar11 = (ulong)dVar20;
      uVar11 = (long)(dVar20 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
      dVar20 = (ppVar10[lVar15].second - local_88) / (double)pvVar23;
      uVar12 = (ulong)dVar20;
      uVar12 = (long)(dVar20 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12;
      lVar16 = uVar11 + uVar12;
      auVar22._8_4_ = (int)((ulong)lVar16 >> 0x20);
      auVar22._0_8_ = lVar16;
      auVar22._12_4_ = 0x45300000;
      dVar20 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) * 0.5;
      uVar13 = (ulong)dVar20;
      uVar13 = (long)(dVar20 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13;
      uVar11 = uVar11 + 1;
      local_78.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pvVar23;
      local_38 = lVar15;
      if (uVar11 < uVar13) {
        do {
          pvVar1 = (vector<double,std::allocator<double>> *)
                   ((this->values_of_landscapes).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar11);
          iVar3._M_current = *(double **)(pvVar1 + 8);
          if (number_of_levels == 0xffffffff) {
            if (iVar3._M_current == *(double **)(pvVar1 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar1,iVar3,(double *)&local_78);
            }
            else {
              *iVar3._M_current =
                   (double)local_78.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              *(double **)(pvVar1 + 8) = iVar3._M_current + 1;
            }
          }
          else {
            pdVar9 = *(double **)pvVar1;
            if ((ulong)((long)iVar3._M_current - (long)pdVar9 >> 3) < local_58) {
              local_50.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_78.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start ^ 0x8000000000000000);
              iVar3._M_current = *(double **)(pvVar1 + 8);
              if (iVar3._M_current == *(double **)(pvVar1 + 0x10)) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)pvVar1,iVar3,
                           (double *)&local_50);
              }
              else {
                *iVar3._M_current =
                     (double)local_50.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                *(double **)(pvVar1 + 8) = iVar3._M_current + 1;
              }
              pvVar4 = (this->values_of_landscapes).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              _Var5._M_current =
                   pvVar4[uVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
              _Var6._M_current =
                   *(pointer *)
                    ((long)&pvVar4[uVar11].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8);
              if ((long)_Var6._M_current - (long)_Var5._M_current >> 3 == local_60) {
                std::
                __make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (_Var5,_Var6,(_Iter_less_iter *)&local_50);
              }
            }
            else if (-(double)local_78.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start < *pdVar9) {
              if (8 < (long)iVar3._M_current - (long)pdVar9) {
                dVar20 = iVar3._M_current[-1];
                iVar3._M_current[-1] = *pdVar9;
                std::
                __adjust_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,double,__gnu_cxx::__ops::_Iter_less_iter>
                          (dVar20,pdVar9,0,(long)iVar3._M_current + (-8 - (long)pdVar9) >> 3);
              }
              pvVar4 = (this->values_of_landscapes).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar15 = *(long *)&pvVar4[uVar11].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data;
              pdVar7 = *(pointer *)
                        ((long)&pvVar4[uVar11].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8);
              lVar17 = (long)pdVar7 - lVar15 >> 3;
              *(ulong *)(lVar15 + -8 + lVar17 * 8) =
                   (ulong)local_78.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start ^ 0x8000000000000000;
              dVar20 = pdVar7[-1];
              lVar16 = lVar17 + -1;
              if (1 < lVar17) {
                do {
                  lVar17 = (lVar16 - (lVar16 + -1 >> 0x3f)) + -1 >> 1;
                  dVar2 = *(double *)(lVar15 + lVar17 * 8);
                  if (dVar20 <= dVar2) break;
                  *(double *)(lVar15 + lVar16 * 8) = dVar2;
                  bVar8 = 2 < lVar16;
                  lVar16 = lVar17;
                } while (bVar8);
              }
              *(double *)(lVar15 + lVar16 * 8) = dVar20;
            }
          }
          local_78.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((double)local_78.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (double)pvVar23);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar13);
      }
      for (; uVar13 <= uVar12; uVar13 = uVar13 + 1) {
        if (0.0 < (double)local_78.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
          pvVar1 = (vector<double,std::allocator<double>> *)
                   ((this->values_of_landscapes).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar13);
          iVar3._M_current = *(double **)(pvVar1 + 8);
          if (number_of_levels == 0xffffffff) {
            if (iVar3._M_current == *(double **)(pvVar1 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar1,iVar3,(double *)&local_78);
            }
            else {
              *iVar3._M_current =
                   (double)local_78.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              *(double **)(pvVar1 + 8) = iVar3._M_current + 1;
            }
          }
          else {
            pdVar9 = *(double **)pvVar1;
            if ((ulong)((long)iVar3._M_current - (long)pdVar9 >> 3) < local_58) {
              local_50.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_78.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start ^ 0x8000000000000000);
              iVar3._M_current = *(double **)(pvVar1 + 8);
              if (iVar3._M_current == *(double **)(pvVar1 + 0x10)) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)pvVar1,iVar3,
                           (double *)&local_50);
              }
              else {
                *iVar3._M_current =
                     (double)local_50.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                *(double **)(pvVar1 + 8) = iVar3._M_current + 1;
              }
              pvVar4 = (this->values_of_landscapes).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              _Var5._M_current =
                   pvVar4[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
              _Var6._M_current =
                   *(pointer *)
                    ((long)&pvVar4[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8);
              if ((long)_Var6._M_current - (long)_Var5._M_current >> 3 == local_60) {
                std::
                __make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (_Var5,_Var6,(_Iter_less_iter *)&local_50);
              }
            }
            else if (-(double)local_78.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start < *pdVar9) {
              if (8 < (long)iVar3._M_current - (long)pdVar9) {
                dVar20 = iVar3._M_current[-1];
                iVar3._M_current[-1] = *pdVar9;
                std::
                __adjust_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,double,__gnu_cxx::__ops::_Iter_less_iter>
                          (dVar20,pdVar9,0,(long)iVar3._M_current + (-8 - (long)pdVar9) >> 3);
              }
              pvVar4 = (this->values_of_landscapes).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar15 = *(long *)&pvVar4[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data;
              pdVar7 = *(pointer *)
                        ((long)&pvVar4[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8);
              lVar17 = (long)pdVar7 - lVar15 >> 3;
              *(double *)(lVar15 + -8 + lVar17 * 8) =
                   -(double)local_78.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              dVar20 = pdVar7[-1];
              lVar16 = lVar17 + -1;
              if (1 < lVar17) {
                do {
                  lVar17 = (lVar16 - (lVar16 + -1 >> 0x3f)) + -1 >> 1;
                  dVar2 = *(double *)(lVar15 + lVar17 * 8);
                  if (dVar20 <= dVar2) break;
                  *(double *)(lVar15 + lVar16 * 8) = dVar2;
                  bVar8 = 2 < lVar16;
                  lVar16 = lVar17;
                } while (bVar8);
              }
              *(double *)(lVar15 + lVar16 * 8) = dVar20;
            }
          }
        }
        local_78.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((double)local_78.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (double)pvVar23);
      }
      lVar15 = local_38 + 1;
      ppVar10 = (local_80->
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar15 != (long)(local_80->
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 4);
  }
  if (number_of_levels != 0xffffffff) {
    pvVar23 = (this->values_of_landscapes).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = (long)(this->values_of_landscapes).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar23;
    if (lVar15 != 0) {
      lVar16 = 0;
      do {
        lVar17 = *(long *)&pvVar23[lVar16].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar18 = (long)*(pointer *)
                        ((long)&pvVar23[lVar16].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) - lVar17;
        if (lVar18 != 0) {
          lVar19 = 0;
          do {
            *(ulong *)(lVar17 + lVar19 * 8) = *(ulong *)(lVar17 + lVar19 * 8) ^ 0x8000000000000000;
            lVar19 = lVar19 + 1;
          } while (lVar18 >> 3 != lVar19);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != (lVar15 >> 3) * -0x5555555555555555);
    }
  }
  pvVar23 = (this->values_of_landscapes).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->values_of_landscapes).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar23) {
    lVar16 = 8;
    lVar15 = 0;
    do {
      lVar17 = *(long *)((long)pvVar23 + lVar16 + -8);
      lVar18 = *(long *)((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar16);
      if (lVar17 != lVar18) {
        uVar13 = lVar18 - lVar17 >> 3;
        lVar19 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                  (lVar17,lVar18,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                  (lVar17,lVar18);
      }
      lVar15 = lVar15 + 1;
      pvVar23 = (this->values_of_landscapes).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x18;
    } while (lVar15 != ((long)(this->values_of_landscapes).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar23 >> 3) *
                       -0x5555555555555555);
  }
  return;
}

Assistant:

void Persistence_landscape_on_grid::set_up_values_of_landscapes(const std::vector<std::pair<double, double> >& p,
                                                                double grid_min_, double grid_max_,
                                                                size_t number_of_points_, unsigned number_of_levels) {
  bool dbg = false;
  if (dbg) {
    std::clog << "Here is the procedure : set_up_values_of_landscapes. The parameters are : grid_min_ : " << grid_min_
              << ", grid_max_ : " << grid_max_ << ", number_of_points_ : " << number_of_points_
              << ", number_of_levels: " << number_of_levels << std::endl;
    std::clog << "Here are the intervals at our disposal : \n";
    for (size_t i = 0; i != p.size(); ++i) {
      std::clog << p[i].first << " , " << p[i].second << std::endl;
    }
  }

  if ((grid_min_ == std::numeric_limits<double>::max()) || (grid_max_ == std::numeric_limits<double>::max())) {
    // in this case, we need to find grid_min_ and grid_min_ based on the data.
    double min = std::numeric_limits<double>::max();
    double max = std::numeric_limits<double>::min();
    for (size_t i = 0; i != p.size(); ++i) {
      if (p[i].first < min) min = p[i].first;
      if (p[i].second > max) max = p[i].second;
    }
    if (grid_min_ == std::numeric_limits<double>::max()) {
      grid_min_ = min;
    } else {
      // in this case grid_max_ == std::numeric_limits<double>::max()
      grid_max_ = max;
    }
  }

  // if number_of_levels == std::numeric_limits<size_t>::max(), then we will have all the nonzero values of landscapes,
  // and will store them in a vector
  // if number_of_levels != std::numeric_limits<size_t>::max(), then we will use those vectors as heaps.
  this->values_of_landscapes = std::vector<std::vector<double> >(number_of_points_ + 1);

  this->grid_min = grid_min_;
  this->grid_max = grid_max_;

  if (grid_max_ <= grid_min_) {
    throw "Wrong parameters of grid_min and grid_max given to the procedure. The program will now terminate.\n";
  }

  double dx = (grid_max_ - grid_min_) / static_cast<double>(number_of_points_);
  // for every interval in the diagram:
  for (size_t int_no = 0; int_no != p.size(); ++int_no) {
    size_t grid_interval_begin = (p[int_no].first - grid_min_) / dx;
    size_t grid_interval_end = (p[int_no].second - grid_min_) / dx;
    size_t grid_interval_midpoint = (size_t)(0.5 * (grid_interval_begin + grid_interval_end));

    if (dbg) {
      std::clog << "Considering an interval : " << p[int_no].first << "," << p[int_no].second << std::endl;

      std::clog << "grid_interval_begin : " << grid_interval_begin << std::endl;
      std::clog << "grid_interval_end : " << grid_interval_end << std::endl;
      std::clog << "grid_interval_midpoint : " << grid_interval_midpoint << std::endl;
    }

    double landscape_value = dx;
    for (size_t i = grid_interval_begin + 1; i < grid_interval_midpoint; ++i) {
      if (dbg) {
        std::clog << "Adding landscape value (going up) for a point : " << i << " equal : " << landscape_value
                  << std::endl;
      }
      if (number_of_levels != std::numeric_limits<unsigned>::max()) {
        // we have a heap of no more that number_of_levels values.
        // Note that if we are using heaps, we want to know the shortest distance in the heap.
        // This is achieved by putting -distance to the heap.
        if (this->values_of_landscapes[i].size() >= number_of_levels) {
          // in this case, the full heap is build, and we need to check if the landscape_value is not larger than the
          // smallest element in the heap.
          if (-landscape_value < this->values_of_landscapes[i].front()) {
            // if it is, we remove the largest value in the heap, and move on.
            std::pop_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] = -landscape_value;
            std::push_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
          }
        } else {
          // in this case we are still filling in the array.
          this->values_of_landscapes[i].push_back(-landscape_value);
          if (this->values_of_landscapes[i].size() == number_of_levels - 1) {
            // this->values_of_landscapes[i].size() == number_of_levels
            // in this case we need to create the heap.
            std::make_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
          }
        }
      } else {
        // we have vector of all values
        this->values_of_landscapes[i].push_back(landscape_value);
      }
      landscape_value += dx;
    }
    for (size_t i = grid_interval_midpoint; i <= grid_interval_end; ++i) {
      if (landscape_value > 0) {
        if (number_of_levels != std::numeric_limits<unsigned>::max()) {
          // we have a heap of no more that number_of_levels values
          if (this->values_of_landscapes[i].size() >= number_of_levels) {
            // in this case, the full heap is build, and we need to check if the landscape_value is not larger than the
            // smallest element in the heap.
            if (-landscape_value < this->values_of_landscapes[i].front()) {
              // if it is, we remove the largest value in the heap, and move on.
              std::pop_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
              this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] = -landscape_value;
              std::push_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            }
          } else {
            // in this case we are still filling in the array.
            this->values_of_landscapes[i].push_back(-landscape_value);
            if (this->values_of_landscapes[i].size() == number_of_levels - 1) {
              // this->values_of_landscapes[i].size() == number_of_levels
              // in this case we need to create the heap.
              std::make_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            }
          }
        } else {
          this->values_of_landscapes[i].push_back(landscape_value);
        }

        if (dbg) {
          std::clog << "Adding landscape value (going down) for a point : " << i << " equal : " << landscape_value
                    << std::endl;
        }
      }
      landscape_value -= dx;
    }
  }

  if (number_of_levels != std::numeric_limits<unsigned>::max()) {
    // in this case, vectors are used as heaps. And, since we want to have the smallest element at the top of
    // each heap, we store minus distances. To get if right at the end, we need to multiply each value
    // in the heap by -1 to get real vector of distances.
    for (size_t pt = 0; pt != this->values_of_landscapes.size(); ++pt) {
      for (size_t j = 0; j != this->values_of_landscapes[pt].size(); ++j) {
        this->values_of_landscapes[pt][j] *= -1;
      }
    }
  }

  // and now we need to sort the values:
  for (size_t pt = 0; pt != this->values_of_landscapes.size(); ++pt) {
    std::sort(this->values_of_landscapes[pt].begin(), this->values_of_landscapes[pt].end(), std::greater<double>());
  }
}